

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O3

void Projection::Initialize(void)

{
  pointer pcVar1;
  ostringstream *poVar2;
  _Rb_tree_header *p_Var3;
  int iVar4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param;
  ParmParse pp;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_proj;
  long *local_260;
  long local_258;
  long local_250 [2];
  ParmParse local_240;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  if ((anonymous_namespace)::initialized == '\0') {
    pcVar1 = local_1b8 + 0x10;
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"nodal_proj","");
    amrex::ParmParse::ParmParse(&local_240,(string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    amrex::ParmParse::query(&local_240,"verbose",&verbose,0);
    amrex::ParmParse::query(&local_240,"proj_tol",&proj_tol,0);
    amrex::ParmParse::query(&local_240,"sync_tol",&sync_tol,0);
    amrex::ParmParse::query(&local_240,"proj_abs_tol",&proj_abs_tol,0);
    amrex::ParmParse::query
              (&local_240,"benchmarking",(bool *)&(anonymous_namespace)::benchmarking,0);
    amrex::ParmParse::query(&local_240,"add_vort_proj",&add_vort_proj,0);
    amrex::ParmParse::query(&local_240,"do_outflow_bcs",&do_outflow_bcs,0);
    amrex::ParmParse::query(&local_240,"rho_wgt_vel_proj",&rho_wgt_vel_proj,0);
    amrex::ParmParse::query
              (&local_240,"agglomeration",(bool *)&(anonymous_namespace)::agglomeration,0);
    amrex::ParmParse::query
              (&local_240,"consolidation",(bool *)&(anonymous_namespace)::consolidation,0);
    amrex::ParmParse::query(&local_240,"max_fmg_iter",&(anonymous_namespace)::max_fmg_iter,0);
    amrex::ParmParse::query
              (&local_240,"use_gauss_seidel",(bool *)&(anonymous_namespace)::use_gauss_seidel,0);
    amrex::ParmParse::query
              (&local_240,"use_harmonic_average",
               (bool *)&(anonymous_namespace)::use_harmonic_average,0);
    amrex::ParmParse::query
              (&local_240,"mg_max_coarsening_level",&(anonymous_namespace)::max_coarsening_level,0);
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"v","");
    iVar4 = amrex::ParmParse::countname(&local_240,(string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if (0 < iVar4) {
      amrex::Abort_host("nodal_proj.v found in inputs. To set verbosity use nodal_proj.verbose");
    }
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"proj","");
    amrex::ParmParse::getEntries
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1e8,(string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if (local_1e8._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_1b8._8_8_ = amrex::OutStream();
      poVar2 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "All runtime options related to the nodal projection now use \'nodal_proj\'.\n",
                 0x4a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Found these depreciated entries in the parameters list: \n",0x39
                );
      amrex::Print::~Print((Print *)local_1b8);
      p_Var3 = &local_1e8._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
        poVar2 = (ostringstream *)(local_1b8 + 0x10);
        p_Var5 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          local_260 = local_250;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_260,*(long *)(p_Var5 + 1),
                     (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
          local_1b8._8_8_ = amrex::OutStream();
          local_1b8._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
          local_1b8._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
               *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"  ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(char *)local_260,local_258);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          amrex::Print::~Print((Print *)local_1b8);
          if (local_260 != local_250) {
            operator_delete(local_260,local_250[0] + 1);
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var3);
      }
      amrex::Abort_host("Replace \'proj\' prefix with \'nodal_proj\' in inputs");
    }
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x364990);
    (anonymous_namespace)::initialized = '\x01';
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1e8);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_240);
  }
  return;
}

Assistant:

void
Projection::Initialize ()
{
    if (initialized) return;

    ParmParse pp("nodal_proj");

    pp.query("verbose",             verbose);
    pp.query("proj_tol",            proj_tol);
    pp.query("sync_tol",            sync_tol);
    pp.query("proj_abs_tol",        proj_abs_tol);
    pp.query("benchmarking",        benchmarking);
    pp.query("add_vort_proj",       add_vort_proj);
    pp.query("do_outflow_bcs",      do_outflow_bcs);
    pp.query("rho_wgt_vel_proj",    rho_wgt_vel_proj);

    pp.query("agglomeration",       agglomeration);
    pp.query("consolidation",       consolidation);
    pp.query("max_fmg_iter",        max_fmg_iter);
    pp.query("use_gauss_seidel",    use_gauss_seidel);
    pp.query("use_harmonic_average", use_harmonic_average);
    pp.query("mg_max_coarsening_level", max_coarsening_level);


    // Abort if old verbose flag is found
    if ( pp.countname("v") > 0 ) {
	amrex::Abort("nodal_proj.v found in inputs. To set verbosity use nodal_proj.verbose");
    }
    // Abort if old "proj." prefix is used.
    std::set<std::string> old_proj = ParmParse::getEntries("proj");
    if (!old_proj.empty()){
	Print()<<"All runtime options related to the nodal projection now use 'nodal_proj'.\n"
	       <<"Found these depreciated entries in the parameters list: \n";
	for ( auto param : old_proj ) {
	    Print()<<"  "<<param<<"\n";
	}
	amrex::Abort("Replace 'proj' prefix with 'nodal_proj' in inputs");
    }
	
    amrex::ExecOnFinalize(Projection::Finalize);

    initialized = true;
}